

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_cleanup(lua_State *L,LexState *ls)

{
  undefined4 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long in_RSI;
  long in_RDI;
  global_State *g;
  
  uVar4 = (ulong)*(uint *)(in_RDI + 8);
  uVar2 = *(undefined8 *)(in_RSI + 0x90);
  lVar5 = (ulong)*(uint *)(in_RSI + 0x98) * 8;
  *(int *)(uVar4 + 0x50) = *(int *)(uVar4 + 0x50) - (int)lVar5;
  *(long *)(uVar4 + 0x90) = lVar5 + *(long *)(uVar4 + 0x90);
  (**(code **)(uVar4 + 0x40))(*(undefined8 *)(uVar4 + 0x48),uVar2,lVar5,0);
  uVar2 = *(undefined8 *)(in_RSI + 0x80);
  lVar5 = (ulong)*(uint *)(in_RSI + 0x88) * 0x10;
  *(int *)(uVar4 + 0x50) = *(int *)(uVar4 + 0x50) - (int)lVar5;
  *(long *)(uVar4 + 0x90) = lVar5 + *(long *)(uVar4 + 0x90);
  (**(code **)(uVar4 + 0x40))(*(undefined8 *)(uVar4 + 0x48),uVar2,lVar5,0);
  uVar1 = *(undefined4 *)(in_RSI + 0x44);
  uVar3 = *(int *)(in_RSI + 0x40) - *(int *)(in_RSI + 0x44);
  *(uint *)(uVar4 + 0x50) = *(int *)(uVar4 + 0x50) - uVar3;
  *(ulong *)(uVar4 + 0x90) = (ulong)uVar3 + *(long *)(uVar4 + 0x90);
  (**(code **)(uVar4 + 0x40))(*(undefined8 *)(uVar4 + 0x48),uVar1,(ulong)uVar3,0);
  return;
}

Assistant:

void lj_lex_cleanup(lua_State *L, LexState *ls)
{
  global_State *g = G(L);
  lj_mem_freevec(g, ls->bcstack, ls->sizebcstack, BCInsLine);
  lj_mem_freevec(g, ls->vstack, ls->sizevstack, VarInfo);
  lj_buf_free(g, &ls->sb);
}